

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O2

void __thiscall
Pubkey_CompressUncompressTest_Test::TestBody(Pubkey_CompressUncompressTest_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar_1;
  string local_d8;
  AssertHelper local_b8;
  Pubkey uncomp_pubkey;
  Pubkey comp_pubkey;
  Pubkey pubkey;
  string ext_key_compressed;
  string ext_key_uncompressed;
  string key_uncompressed;
  
  std::__cxx11::string::string
            ((string *)&key_uncompressed,
             "076468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955400e1a8f159b5dcea116049d09eb756b80d52aeaabb195b343cf713f62f01a73"
             ,(allocator *)&ext_key_uncompressed);
  std::__cxx11::string::string
            ((string *)&ext_key_uncompressed,
             "046468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955400e1a8f159b5dcea116049d09eb756b80d52aeaabb195b343cf713f62f01a73"
             ,(allocator *)&ext_key_compressed);
  std::__cxx11::string::string
            ((string *)&ext_key_compressed,
             "036468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955",
             (allocator *)&local_d8);
  cfd::core::Pubkey::Pubkey(&pubkey,&key_uncompressed);
  cfd::core::Pubkey::Compress(&comp_pubkey,&pubkey);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_d8,&comp_pubkey);
  testing::internal::CmpHelperSTREQ
            ((internal *)&uncomp_pubkey,"comp_pubkey.GetHex().c_str()","ext_key_compressed.c_str()",
             local_d8._M_dataplus._M_p,ext_key_compressed._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d8);
  if ((char)uncomp_pubkey.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    testing::Message::Message((Message *)&local_d8);
    if (uncomp_pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)uncomp_pubkey.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0xcc,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&uncomp_pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  cfd::core::Pubkey::Uncompress(&uncomp_pubkey,&comp_pubkey);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_d8,&uncomp_pubkey);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"uncomp_pubkey.GetHex().c_str()","ext_key_uncompressed.c_str()"
             ,local_d8._M_dataplus._M_p,ext_key_uncompressed._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_d8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_pubkey.cpp"
               ,0xcf,pcVar1);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&uncomp_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&comp_pubkey);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&pubkey);
  std::__cxx11::string::~string((string *)&ext_key_compressed);
  std::__cxx11::string::~string((string *)&ext_key_uncompressed);
  std::__cxx11::string::~string((string *)&key_uncompressed);
  return;
}

Assistant:

TEST(Pubkey, CompressUncompressTest) {
  std::string key_uncompressed = "076468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955400e1a8f159b5dcea116049d09eb756b80d52aeaabb195b343cf713f62f01a73";
  std::string ext_key_uncompressed = "046468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955400e1a8f159b5dcea116049d09eb756b80d52aeaabb195b343cf713f62f01a73";
  std::string ext_key_compressed = "036468efc14b8512007bb720d6e7d4217a6686095a79b57e50dd48355110422955";
  Pubkey pubkey = Pubkey(key_uncompressed);
  Pubkey comp_pubkey = pubkey.Compress();
  EXPECT_STREQ(comp_pubkey.GetHex().c_str(), ext_key_compressed.c_str());

  Pubkey uncomp_pubkey = comp_pubkey.Uncompress();
  EXPECT_STREQ(uncomp_pubkey.GetHex().c_str(), ext_key_uncompressed.c_str());
}